

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_tests.cpp
# Opt level: O3

void __thiscall
omp_range_simple_case_three_overload_Test::TestBody(omp_range_simple_case_three_overload_Test *this)

{
  char *message;
  long lVar1;
  initializer_list<long> __l;
  value_type v;
  vector<long,_std::allocator<long>_> expecting;
  vector<long,_std::allocator<long>_> result;
  undefined4 local_80 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  AssertHelper local_70;
  Message local_68;
  vector<long,_std::allocator<long>_> local_60;
  vector<long,_std::allocator<long>_> local_48;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3;
  uStack_30 = 4;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x1;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x2;
  local_28 = 5;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_48;
  std::vector<long,_std::allocator<long>_>::vector(&local_60,__l,(allocator_type *)local_80);
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (long *)0x0;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (long *)0x0;
  lVar1 = 1;
  do {
    local_80[0] = (undefined4)lVar1;
    if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<long,std::allocator<long>>::_M_realloc_insert<int&>
                ((vector<long,std::allocator<long>> *)&local_48,
                 (iterator)
                 local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)local_80);
    }
    else {
      *local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_finish = lVar1;
      local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 6);
  testing::internal::
  CmpHelperEQ<std::vector<long,std::allocator<long>>,std::vector<long,std::allocator<long>>>
            ((internal *)local_80,"result","expecting",&local_48,&local_60);
  if (local_80[0]._0_1_ == (allocator_type)0x0) {
    testing::Message::Message(&local_68);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/range_tests.cpp"
               ,0x3a,message);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_68.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(omp_range, simple_case_three_overload) {
  const std::vector<std::int64_t> expecting = {1, 2, 3, 4, 5};

  std::vector<std::int64_t> result;

  for (auto v : omp::range(1, 6))
    result.emplace_back(v);

  ASSERT_EQ(result, expecting);
}